

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureDoesNotSendRedundantResendRequests::RunImpl
          (TestsessionFixtureDoesNotSendRedundantResendRequests *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureDoesNotSendRedundantResendRequestsHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureDoesNotSendRedundantResendRequests *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureDoesNotSendRedundantResendRequestsHelper::
  sessionFixtureDoesNotSendRedundantResendRequestsHelper
            ((sessionFixtureDoesNotSendRedundantResendRequestsHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureDoesNotSendRedundantResendRequestsHelper>
            ((sessionFixtureDoesNotSendRedundantResendRequestsHelper *)local_648,
             &(this->super_Test).m_details);
  sessionFixtureDoesNotSendRedundantResendRequestsHelper::
  ~sessionFixtureDoesNotSendRedundantResendRequestsHelper
            ((sessionFixtureDoesNotSendRedundantResendRequestsHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, DoesNotSendRedundantResendRequests) {
  createSession(1);
  object->setSendRedundantResendRequests(false);
  CHECK(!object->getSendRedundantResendRequests());
}